

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hsluv.c
# Opt level: O0

void test_hsluv2rgb(void)

{
  int iVar1;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double b;
  double g;
  double r;
  double in_stack_00000030;
  int i;
  double local_38;
  double local_30;
  double local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x1000; local_4 = local_4 + 1) {
    acutest_case_("%s",snapshot + local_4);
    hsluv2rgb(in_stack_00000030,r,g,(double *)b,in_stack_00000010,in_stack_00000008);
    if ((double)local_10 - snapshot[local_4].rgb_r < 0.0) {
      local_28 = -((double)local_10 - snapshot[local_4].rgb_r);
    }
    else {
      local_28 = (double)local_10 - snapshot[local_4].rgb_r;
    }
    iVar1 = acutest_check_((int)(ulong)(local_28 < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x22,"%s channel","red");
    if (iVar1 == 0) {
      acutest_message_(local_10,"Produced: %f");
      acutest_message_((char *)snapshot[local_4].rgb_r,"Expected: %f");
    }
    if ((double)local_18 - snapshot[local_4].rgb_g < 0.0) {
      local_30 = -((double)local_18 - snapshot[local_4].rgb_g);
    }
    else {
      local_30 = (double)local_18 - snapshot[local_4].rgb_g;
    }
    iVar1 = acutest_check_((int)(ulong)(local_30 < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x23,"%s channel","green");
    if (iVar1 == 0) {
      acutest_message_(local_18,"Produced: %f");
      acutest_message_((char *)snapshot[local_4].rgb_g,"Expected: %f");
    }
    if ((double)local_20 - snapshot[local_4].rgb_b < 0.0) {
      local_38 = -((double)local_20 - snapshot[local_4].rgb_b);
    }
    else {
      local_38 = (double)local_20 - snapshot[local_4].rgb_b;
    }
    iVar1 = acutest_check_((int)(ulong)(local_38 < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x24,"%s channel","blue");
    if (iVar1 == 0) {
      acutest_message_(local_20,"Produced: %f");
      acutest_message_((char *)snapshot[local_4].rgb_b,"Expected: %f");
    }
  }
  return;
}

Assistant:

static void
test_hsluv2rgb(void)
{
    int i;

    for(i = 0; i < snapshot_n; i++) {
        double r, g, b;

        TEST_CASE(snapshot[i].hex_str);

        hsluv2rgb(snapshot[i].hsluv_h, snapshot[i].hsluv_s, snapshot[i].hsluv_l, &r, &g, &b);

        TEST_CHANNEL("red", r, snapshot[i].rgb_r);
        TEST_CHANNEL("green", g, snapshot[i].rgb_g);
        TEST_CHANNEL("blue", b, snapshot[i].rgb_b);
    }
}